

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O3

void embree::storePPM(Ref<embree::Image> *img,FileName *fileName)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  Image *pIVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  Color4 c;
  fstream file;
  undefined1 auStack_268 [15];
  char local_259;
  float local_258;
  float local_254;
  float local_250;
  long local_240 [2];
  long local_230;
  undefined4 auStack_224 [125];
  
  std::fstream::fstream(local_240);
  lVar1 = *(long *)(local_240[0] + -0x18);
  *(undefined4 *)((long)auStack_224 + lVar1) = 5;
  std::ios::clear((int)auStack_268 + (int)lVar1 + 0x28);
  std::fstream::open((char *)local_240,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6",2);
  cVar2 = (char)(ostream *)&local_230;
  std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  plVar4 = (long *)std::ostream::operator<<((ostream *)&local_230,0xff);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  pIVar6 = img->ptr;
  if (pIVar6->height != 0) {
    uVar7 = 0;
    do {
      if (pIVar6->width != 0) {
        uVar5 = 0;
        do {
          (*(pIVar6->super_RefCount)._vptr_RefCount[4])(&local_258,pIVar6,uVar5,uVar7);
          fVar8 = local_258;
          if (1.0 <= local_258) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_259 = (char)(int)(fVar9 * 255.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_259,1);
          fVar8 = local_254;
          if (1.0 <= local_254) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_259 = (char)(int)(fVar9 * 255.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_259,1);
          fVar8 = local_250;
          if (1.0 <= local_250) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_259 = (char)(int)(fVar9 * 255.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_259,1);
          uVar5 = uVar5 + 1;
          pIVar6 = img->ptr;
        } while (uVar5 < pIVar6->width);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < pIVar6->height);
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void storePPM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "P6" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << 255 << std::endl;

    /* write image */
    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        const Color4 c = img->get(x,y);
        file << (unsigned char)(clamp(c.r)*255.0f);
        file << (unsigned char)(clamp(c.g)*255.0f);
        file << (unsigned char)(clamp(c.b)*255.0f);
      }
    }
  }